

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBuildVisitor.cpp
# Opt level: O3

void __thiscall CBuildVisitor::Visit(CBuildVisitor *this,COpExp *expression)

{
  IExpression *pIVar1;
  ISubtreeWrapper *pIVar2;
  ISubtreeWrapper *pIVar3;
  ISubtreeWrapper *pIVar4;
  TOperationType _operation;
  CBinopExpression *this_00;
  ISubtreeWrapper *pIVar5;
  CBuildVisitor *this_01;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_50;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_48;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_40;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"IRT builder: COpExp\n",0x14);
  pIVar1 = (expression->leftOperand)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  (*(code *)*(pIVar1->super_PositionedNode).super_INode._vptr_INode)(pIVar1,this);
  pIVar2 = (this->wrapper)._M_t.
           super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>.
           _M_t.
           super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
           .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl;
  (this->wrapper)._M_t.
  super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
  super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
  super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl = (ISubtreeWrapper *)0x0;
  this_01 = (CBuildVisitor *)
            (expression->rightOperand)._M_t.
            super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
            super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
            super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  (*(code *)*(((PositionedNode *)&this_01->super_IVisitor)->super_INode)._vptr_INode)(this_01,this);
  pIVar3 = (this->wrapper)._M_t.
           super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>.
           _M_t.
           super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
           .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl;
  (this->wrapper)._M_t.
  super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
  super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
  super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl = (ISubtreeWrapper *)0x0;
  _operation = operatorAst2Irt(this_01,expression->operation);
  this_00 = (CBinopExpression *)operator_new(0x20);
  (**pIVar2->_vptr_ISubtreeWrapper)(&local_38,pIVar2);
  local_50._M_head_impl = local_38._M_head_impl;
  local_38._M_head_impl = (CExpression *)0x0;
  (**pIVar3->_vptr_ISubtreeWrapper)(&local_48,pIVar3);
  local_40._M_head_impl = local_48._M_head_impl;
  local_48._M_head_impl = (CExpression *)0x0;
  IRT::CBinopExpression::CBinopExpression
            (this_00,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                      *)&local_50,
             (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
             &local_40,_operation);
  if (local_40._M_head_impl != (CExpression *)0x0) {
    (*((local_40._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
  }
  local_40._M_head_impl = (CExpression *)0x0;
  if (local_48._M_head_impl != (CExpression *)0x0) {
    (*((local_48._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
  }
  if (local_50._M_head_impl != (CExpression *)0x0) {
    (*((local_50._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
  }
  local_50._M_head_impl = (CExpression *)0x0;
  if (local_38._M_head_impl != (CExpression *)0x0) {
    (*((local_38._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
  }
  pIVar5 = (ISubtreeWrapper *)operator_new(0x10);
  pIVar5->_vptr_ISubtreeWrapper = (_func_int **)&PTR_ToExpression_00181498;
  pIVar5[1]._vptr_ISubtreeWrapper = (_func_int **)this_00;
  pIVar4 = (this->wrapper)._M_t.
           super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>.
           _M_t.
           super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
           .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl;
  (this->wrapper)._M_t.
  super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
  super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
  super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl = pIVar5;
  if (pIVar4 != (ISubtreeWrapper *)0x0) {
    operator_delete(pIVar4);
  }
  operator_delete(pIVar3);
  operator_delete(pIVar2);
  return;
}

Assistant:

void CBuildVisitor::Visit( COpExp &expression ) {
    std::cout << "IRT builder: COpExp\n";
    expression.leftOperand->Accept( *this );
    std::unique_ptr<IRT::ISubtreeWrapper> wrapperLeft = std::move( wrapper );

    expression.rightOperand->Accept( *this );
    std::unique_ptr<IRT::ISubtreeWrapper> wrapperRight = std::move( wrapper );

    IRT::enums::TOperationType operatorType = operatorAst2Irt( expression.operation );

    std::unique_ptr<const IRT::CExpression> binOpPtr = std::unique_ptr<const IRT::CExpression>(
            new IRT::CBinopExpression(
                    std::move( wrapperLeft->ToExpression( )),
                    std::move( wrapperRight->ToExpression( )),
                    operatorType ));
    updateSubtreeWrapper( new IRT::CExpressionWrapper( std::move( binOpPtr )));
}